

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.cpp
# Opt level: O0

object_t *
acto::core::make_instance
          (actor_ref *context,actor_thread opt,
          unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *body)

{
  actor_thread thread_opt;
  runtime_t *this;
  object_t *poVar1;
  unique_ptr<acto::actor,_std::default_delete<acto::actor>_> local_30;
  actor_ref local_28;
  unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *local_20;
  unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *body_local;
  actor_ref *paStack_10;
  actor_thread opt_local;
  actor_ref *context_local;
  
  local_20 = body;
  body_local._4_4_ = opt;
  paStack_10 = context;
  this = runtime_t::instance();
  actor_ref::actor_ref(&local_28,context);
  thread_opt = body_local._4_4_;
  std::unique_ptr<acto::actor,_std::default_delete<acto::actor>_>::unique_ptr(&local_30,body);
  poVar1 = runtime_t::make_instance(this,&local_28,thread_opt,&local_30);
  std::unique_ptr<acto::actor,_std::default_delete<acto::actor>_>::~unique_ptr(&local_30);
  actor_ref::~actor_ref(&local_28);
  return poVar1;
}

Assistant:

object_t* make_instance(actor_ref context,
                        const actor_thread opt,
                        std::unique_ptr<actor> body) {
  return runtime_t::instance()->make_instance(std::move(context), opt,
                                              std::move(body));
}